

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tristrip.cpp
# Opt level: O2

void __thiscall rw::Geometry::buildTristrips(Geometry *this)

{
  uint32 *puVar1;
  long *plVar2;
  char *pcVar3;
  undefined1 *puVar4;
  byte *pbVar5;
  byte bVar6;
  undefined2 uVar7;
  ushort uVar8;
  ushort uVar9;
  ushort uVar10;
  ushort uVar11;
  ushort uVar12;
  int iVar13;
  Triangle *pTVar14;
  LLLink *pLVar15;
  MeshHeader *pMVar16;
  LLLink *pLVar17;
  int32 i;
  uint uVar18;
  StripNode *pSVar19;
  long lVar20;
  long lVar21;
  void *pvVar22;
  LLLink *pLVar23;
  MeshHeader *pMVar24;
  uint16 uVar25;
  ulong uVar26;
  uint uVar27;
  StripNode *pSVar28;
  LLLink *pLVar29;
  long lVar30;
  ulong uVar31;
  uint uVar32;
  long lVar33;
  uint uVar34;
  long lVar35;
  char cVar36;
  uint uVar37;
  ulong uVar38;
  ulong uVar39;
  ushort uVar40;
  ulong uVar41;
  MeshHeader *pMVar42;
  bool bVar43;
  StripMesh smesh;
  
  allocateMeshes(this,(this->matList).numMaterials,0,1);
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/tristrip.cpp line: 575"
  ;
  pSVar19 = (StripNode *)(*DAT_00143848)((long)this->numTriangles * 0x38,0x1000f);
  pMVar42 = this->meshHeader;
  lVar30 = 0;
  smesh.nodes = pSVar19;
LAB_0010ee93:
  if (lVar30 < (this->matList).numMaterials) {
    smesh.loneNodes.link.next = &smesh.loneNodes.link;
    smesh.endNodes.link.next = &smesh.endNodes.link;
    smesh.numNodes = 0;
    for (lVar20 = 0; lVar20 < this->numTriangles; lVar20 = lVar20 + 1) {
      pTVar14 = this->triangles;
      if (pTVar14[lVar20].matId == (uint16)lVar30) {
        lVar35 = (long)smesh.numNodes;
        smesh.numNodes = smesh.numNodes + 1;
        smesh.nodes[lVar35].v[0] = pTVar14[lVar20].v[0];
        smesh.nodes[lVar35].v[1] = pTVar14[lVar20].v[1];
        smesh.nodes[lVar35].v[2] = pTVar14[lVar20].v[2];
        smesh.nodes[lVar35].e[0].node = 0;
        smesh.nodes[lVar35].e[1].node = 0;
        smesh.nodes[lVar35].e[2].node = 0;
        puVar4 = &smesh.nodes[lVar35].e[0].field_0x4;
        *puVar4 = *puVar4 & 0xf6;
        puVar4 = &smesh.nodes[lVar35].e[1].field_0x4;
        *puVar4 = *puVar4 & 0xf6;
        puVar4 = &smesh.nodes[lVar35].e[2].field_0x4;
        *puVar4 = *puVar4 & 0xf6;
        smesh.nodes[lVar35].field_0x6 = smesh.nodes[lVar35].field_0x6 & 0xe0;
        smesh.nodes[lVar35].stripId = -1;
        smesh.nodes[lVar35].inlist.next = (LLLink *)0x0;
        smesh.nodes[lVar35].inlist.prev = (LLLink *)0x0;
      }
    }
    for (lVar20 = 0; uVar26 = (ulong)smesh.numNodes, lVar20 < (long)uVar26; lVar20 = lVar20 + 1) {
      uVar26 = 0;
LAB_0010ef74:
      uVar31 = uVar26;
      if (uVar31 != 3) {
        bVar6 = smesh.nodes[lVar20].e[uVar31].field_0x4;
        if ((bVar6 & 1) == 0) {
          uVar26 = uVar31 + 1;
          uVar39 = uVar26 & 0xffffffff;
          if (uVar31 == 2) {
            uVar39 = 0;
          }
          uVar38 = (ulong)(uint)smesh.numNodes;
          if (smesh.numNodes < 1) {
            uVar38 = 0;
          }
          lVar35 = 0;
          pSVar19 = smesh.nodes;
          for (uVar41 = 0; uVar41 != uVar38; uVar41 = uVar41 + 1) {
            cVar36 = (bVar6 & 0xf0) + 1;
            for (lVar33 = 1; lVar33 != 4; lVar33 = lVar33 + 1) {
              if (((pSVar19->e[lVar33 + -1].field_0x4 & 1) == 0) &&
                 (smesh.nodes[lVar20].v[uVar39] == pSVar19->v[lVar33 + -1])) {
                lVar21 = 0;
                if (lVar33 != 3) {
                  lVar21 = lVar33;
                }
                if (smesh.nodes[lVar20].v[uVar31] == smesh.nodes[uVar41].v[lVar21]) {
                  smesh.nodes[lVar20].e[uVar31].node = (int32)uVar41;
                  smesh.nodes[lVar20].e[uVar31].field_0x4 = cVar36;
                  *(int *)((long)(smesh.nodes)->v + lVar33 * 8 + lVar35) = (int)lVar20;
                  *(byte *)((long)(smesh.nodes)->e + lVar33 * 8 + lVar35 + -4) =
                       (*(byte *)((long)(smesh.nodes)->e + lVar33 * 8 + lVar35 + -4) & 0xf0) +
                       (char)uVar31 * '\x02' + '\x01';
                  goto LAB_0010ef74;
                }
              }
              cVar36 = cVar36 + '\x02';
            }
            lVar35 = lVar35 + 0x38;
            pSVar19 = pSVar19 + 1;
          }
        }
        else {
          uVar26 = uVar31 + 1;
        }
        goto LAB_0010ef74;
      }
    }
    smesh.loneNodes.link.prev = smesh.loneNodes.link.next;
    smesh.endNodes.link.prev = smesh.endNodes.link.next;
    for (lVar20 = 0; lVar20 < (int)uVar26; lVar20 = lVar20 + 1) {
      if (smesh.nodes[lVar20].stripId < 0) {
        pSVar19 = smesh.nodes + lVar20;
        pSVar19->stripId = (int32)lVar20;
        pLVar23 = &pSVar19->inlist;
        if ((pSVar19->e[2].field_0x4 & 1) != 0 ||
            (byte)((pSVar19->e[1].field_0x4 & 1) + (pSVar19->e[0].field_0x4 & 1)) != '\0') {
          (pSVar19->inlist).next = &smesh.endNodes.link;
          (pSVar19->inlist).prev = smesh.endNodes.link.prev;
          (smesh.endNodes.link.prev)->next = pLVar23;
          pSVar19->field_0x6 = pSVar19->field_0x6 | 0x10;
          pSVar28 = pSVar19;
          do {
            lVar35 = 0xc;
            while( true ) {
              if (lVar35 == 0x24) {
                smesh.endNodes.link.prev = pLVar23;
                if (pSVar28 != pSVar19) {
                  smesh.endNodes.link.prev = &pSVar28->inlist;
                  (pSVar28->inlist).next = &smesh.endNodes.link;
                  (pSVar28->inlist).prev = pLVar23;
                  pLVar23->next = smesh.endNodes.link.prev;
                  pSVar28->field_0x6 = pSVar28->field_0x6 | 0x10;
                }
                goto LAB_0010f085;
              }
              if (((*(byte *)((long)pSVar28->v + lVar35) & 1) != 0) &&
                 (iVar13 = *(int *)((long)pSVar28->v + lVar35 + -4), smesh.nodes[iVar13].stripId < 0
                 )) break;
              lVar35 = lVar35 + 8;
            }
            smesh.nodes[iVar13].stripId = pSVar28->stripId;
            bVar6 = *(byte *)((long)pSVar28->v + lVar35);
            *(byte *)((long)pSVar28->v + lVar35) = bVar6 ^ 8;
            pbVar5 = &smesh.nodes[iVar13].e[0].field_0x4 + (ulong)(bVar6 & 6) * 4;
            *pbVar5 = *pbVar5 ^ 8;
            pSVar28 = smesh.nodes + iVar13;
          } while( true );
        }
        (pSVar19->inlist).next = &smesh.loneNodes.link;
        (pSVar19->inlist).prev = smesh.loneNodes.link.prev;
        (smesh.loneNodes.link.prev)->next = pLVar23;
        smesh.loneNodes.link.prev = pLVar23;
      }
LAB_0010f085:
      uVar26 = (ulong)(uint)smesh.numNodes;
    }
    lVar20 = lVar30 * 0x18;
    plVar2 = (long *)((long)pMVar42 + lVar20 + 0x10);
    *(Material **)((long)pMVar42 + lVar20 + 0x20) = (this->matList).materials[lVar30];
    allocLocation =
         "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/tristrip.cpp line: 456"
    ;
    pvVar22 = (void *)(*DAT_00143848)((long)((int)uVar26 * 5) * 2,0x1000f);
    *(void **)((long)pMVar42 + lVar20 + 0x10) = pvVar22;
    memset(pvVar22,0xff,(long)smesh.numNodes * 10);
    pLVar15 = smesh.endNodes.link.next;
    pSVar19 = smesh.nodes;
    uVar26 = 1;
    pLVar23 = smesh.endNodes.link.next;
    do {
      pLVar29 = pLVar23;
      do {
        if (pLVar29 == &smesh.endNodes.link) goto LAB_0010f3fa;
        pLVar23 = pLVar29->next;
        pLVar17 = pLVar29 + -1;
        pSVar28 = (StripNode *)&pLVar29[-3].prev;
        pLVar29 = pLVar23;
      } while ((((long)pSVar28 - (long)pSVar19) / 0x38 != (long)*(int *)&pLVar17->prev) ||
              (uVar18 = getNextEdge(pSVar28,-1), (int)uVar18 < 0));
      iVar13 = (int)plVar2[1];
      lVar20 = (long)iVar13;
      uVar31 = (ulong)(iVar13 + 2);
      if (lVar20 == 0) {
        uVar31 = 0;
      }
      if ((int)uVar26 == 0) {
        uVar39 = (ulong)(uVar18 + 1) % 3;
        uVar27 = (uint)uVar39;
        uVar32 = uVar27 + 1;
        if (uVar27 + 1 == 3) {
          uVar32 = 0;
        }
        lVar35 = *plVar2;
        *(undefined2 *)(lVar35 + uVar31 * 2) = *(undefined2 *)((long)pSVar28 + (ulong)uVar32 * 2);
      }
      else {
        uVar39 = (ulong)(uVar18 + 2) % 3;
        lVar35 = *plVar2;
        *(undefined2 *)(lVar35 + uVar31 * 2) = *(undefined2 *)((long)pSVar28 + uVar39 * 2);
        uVar27 = (int)uVar39 + 1;
        if (uVar27 == 3) {
          uVar27 = 0;
        }
      }
      *(undefined2 *)(lVar35 + (ulong)((int)uVar31 + 1) * 2) =
           *(undefined2 *)((long)pSVar28 + (ulong)uVar27 * 2);
      uVar27 = (int)uVar31 + 2;
      uVar32 = 0xffffffff;
      while( true ) {
        uVar37 = (uint)uVar26;
        uVar34 = (uint)uVar39;
        if ((int)uVar18 < 0) break;
        uVar34 = ((uint)(uVar34 < 2) * 3 + uVar34) - 2;
        bVar43 = uVar34 == uVar18;
        if (uVar32 == bVar43) {
          *(undefined2 *)(lVar35 + (ulong)uVar27 * 2) =
               *(undefined2 *)(lVar35 + (ulong)(uVar27 - 2) * 2);
          uVar27 = uVar27 + 1;
          uVar37 = (uint)(uVar37 == 0);
        }
        if (uVar34 == uVar18) {
          uVar26 = (ulong)(uVar18 + 1);
          if (uVar18 + 1 == 3) {
            uVar26 = 0;
          }
          uVar25 = pSVar28->v[uVar26];
        }
        else {
          uVar25 = pSVar28->v[uVar18];
        }
        *(uint16 *)(lVar35 + (ulong)uVar27 * 2) = uVar25;
        uVar27 = uVar27 + 1;
        *(uint *)(plVar2 + 1) = uVar27;
        uVar26 = (ulong)(uVar37 == 0);
        uVar32 = *(uint *)&pSVar28->e[uVar18].field_0x4 >> 1 & 3;
        uVar39 = (ulong)uVar32;
        pSVar28 = pSVar19 + pSVar28->e[uVar18].node;
        uVar18 = getNextEdge(pSVar28,uVar32);
        uVar32 = (uint)bVar43;
      }
      uVar26 = (ulong)(uVar34 - 1);
      if (uVar34 == 0) {
        uVar26 = 2;
      }
      uVar25 = pSVar28->v[uVar26];
      *(uint *)(plVar2 + 1) = uVar27 + 1;
      *(uint16 *)(lVar35 + (ulong)uVar27 * 2) = uVar25;
      uVar26 = (ulong)(uVar37 == 0);
      if (iVar13 != 0) {
        *(undefined2 *)(lVar35 + lVar20 * 2) = *(undefined2 *)(lVar35 + -2 + lVar20 * 2);
        *(undefined2 *)(lVar35 + 2 + lVar20 * 2) = *(undefined2 *)(lVar35 + 4 + lVar20 * 2);
      }
    } while( true );
  }
  (*DAT_00143840)(pSVar19);
  pMVar24 = this->meshHeader;
  this->meshHeader = (MeshHeader *)0x0;
  allocateMeshes(this,(uint)pMVar24->numMeshes,pMVar24->totalIndices,0);
  pMVar16 = this->meshHeader;
  pMVar16->flags = 1;
  lVar30 = 0x10;
  pvVar22 = *(void **)(pMVar16 + 1);
  for (uVar26 = 0; uVar26 < pMVar24->numMeshes; uVar26 = uVar26 + 1) {
    *(undefined8 *)((long)&pMVar16[1].flags + lVar30) =
         *(undefined8 *)((long)&pMVar42[1].flags + lVar30);
    uVar18 = *(uint *)((long)&pMVar42->totalIndices + lVar30);
    *(uint *)((long)&pMVar16->totalIndices + lVar30) = uVar18;
    *(void **)((long)&pMVar16->flags + lVar30) = pvVar22;
    memcpy(pvVar22,*(void **)((long)&pMVar42->flags + lVar30),(ulong)uVar18 * 2);
    (*DAT_00143840)(*(undefined8 *)((long)&pMVar42->flags + lVar30));
    lVar30 = lVar30 + 0x18;
    pvVar22 = (void *)((long)pvVar22 + (ulong)uVar18 * 2);
  }
  (*DAT_00143840)(pMVar24);
  allocLocation =
       "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/tristrip.cpp line: 632"
  ;
  pvVar22 = (void *)(*DAT_00143848)((long)this->numTriangles);
  memset(pvVar22,0,(long)this->numTriangles);
  pMVar24 = this->meshHeader;
  pMVar42 = pMVar24 + 1;
  uVar18 = 0;
  do {
    if (pMVar24->numMeshes <= uVar18) {
      uVar26 = 0;
      uVar31 = (ulong)(uint)this->numTriangles;
      if (this->numTriangles < 1) {
        uVar31 = uVar26;
      }
      do {
        if (uVar31 == uVar26) {
          (*DAT_00143840)(pvVar22);
          return;
        }
        pcVar3 = (char *)((long)pvVar22 + uVar26);
        uVar26 = uVar26 + 1;
      } while (*pcVar3 != '\0');
LAB_0010f7a0:
      fwrite("TRISTRIP verify failed\n",0x17,1,_stderr);
      exit(1);
    }
    uVar32 = MaterialList::findIndex(&this->matList,*(Material **)(pMVar42 + 1));
    uVar26 = 0;
    uVar27 = 0;
LAB_0010f66e:
    if (uVar26 < pMVar42->totalIndices - 2) {
      lVar30 = *(long *)pMVar42;
      iVar13 = (int)uVar26;
      uVar8 = *(ushort *)(lVar30 + (ulong)(uVar27 + iVar13) * 2);
      uVar27 = uVar27 ^ 1;
      uVar9 = *(ushort *)(lVar30 + (ulong)(uVar27 + iVar13) * 2);
      uVar10 = *(ushort *)(lVar30 + (ulong)(iVar13 + 2) * 2);
      iVar13 = this->numVertices;
      if ((((int)(uint)uVar8 < iVar13) && ((int)(uint)uVar9 < iVar13)) &&
         ((int)(uint)uVar10 < iVar13)) {
        if (((uVar8 != uVar9) && (uVar8 != uVar10)) && (uVar9 != uVar10)) {
          uVar31 = (ulong)(uint)this->numTriangles;
          if (this->numTriangles < 1) {
            uVar31 = 0;
          }
          pTVar14 = this->triangles;
          uVar39 = 0;
          do {
            if (uVar31 == uVar39) goto LAB_0010f7a0;
            if ((*(char *)((long)pvVar22 + uVar39) == '\0') && (uVar32 == pTVar14[uVar39].matId)) {
              uVar11 = pTVar14[uVar39].v[0];
              uVar40 = pTVar14[uVar39].v[1];
              uVar12 = pTVar14[uVar39].v[2];
              if ((((uVar11 == uVar8) && ((uVar40 == uVar9 && (uVar40 = uVar9, uVar12 == uVar10))))
                  || ((uVar40 == uVar8 && ((uVar12 == uVar9 && (uVar11 == uVar10)))))) ||
                 ((uVar12 == uVar8 && ((uVar11 == uVar9 && (uVar40 == uVar10))))))
              goto LAB_0010f760;
            }
            uVar39 = uVar39 + 1;
          } while( true );
        }
        goto LAB_0010f765;
      }
      fprintf(_stderr,"triangle %d %d %d out of range (%d)\n");
      goto LAB_0010f7a0;
    }
    pMVar42 = (MeshHeader *)&pMVar42[1].totalIndices;
    uVar18 = uVar18 + 1;
    pMVar24 = this->meshHeader;
  } while( true );
LAB_0010f760:
  *(undefined1 *)((long)pvVar22 + uVar39) = 1;
LAB_0010f765:
  uVar26 = uVar26 + 1;
  goto LAB_0010f66e;
LAB_0010f3fa:
  while (pLVar29 = pLVar15, pLVar23 = smesh.loneNodes.link.next, pLVar29 != &smesh.endNodes.link) {
    pLVar15 = pLVar29->next;
    if ((*(byte *)((long)&pLVar29[-1].next + 4) >> 3 & 1) == 0 &&
        (byte)((*(byte *)((long)&pLVar29[-2].prev + 4) >> 3 & 1) +
              ((*(uint *)((long)&pLVar29[-2].next + 4) >> 3 & 1) != 0)) == '\0') {
      uVar18 = *(uint *)(plVar2 + 1);
      lVar20 = *plVar2;
      if ((ulong)uVar18 == 0) {
        uVar32 = 0;
      }
      else {
        *(undefined2 *)(lVar20 + (ulong)uVar18 * 2) =
             *(undefined2 *)(lVar20 + (ulong)(uVar18 - 1) * 2);
        uVar32 = uVar18 + 2;
        *(undefined2 *)(lVar20 + (ulong)(uVar18 + 1) * 2) =
             *(undefined2 *)((long)pLVar29 + (ulong)((int)uVar26 == 0) * 2 + -0x28);
      }
      uVar31 = (ulong)((int)uVar26 == 0);
      *(undefined2 *)(lVar20 + (ulong)uVar32 * 2) =
           *(undefined2 *)((long)pLVar29 + uVar31 * 2 + -0x28);
      *(undefined2 *)(lVar20 + (ulong)(uVar32 + 1) * 2) =
           *(undefined2 *)((long)pLVar29 + uVar26 * 2 + -0x28);
      uVar7 = *(undefined2 *)((long)&pLVar29[-3].prev + 4);
      *(uint *)(plVar2 + 1) = uVar32 + 3;
      *(undefined2 *)(lVar20 + (ulong)(uVar32 + 2) * 2) = uVar7;
      uVar26 = uVar31;
    }
  }
  while (pLVar23 != &smesh.loneNodes.link) {
    pLVar15 = pLVar23->next;
    uVar18 = *(uint *)(plVar2 + 1);
    lVar20 = *plVar2;
    if ((ulong)uVar18 == 0) {
      uVar32 = 0;
    }
    else {
      *(undefined2 *)(lVar20 + (ulong)uVar18 * 2) =
           *(undefined2 *)(lVar20 + (ulong)(uVar18 - 1) * 2);
      uVar32 = uVar18 + 2;
      *(undefined2 *)(lVar20 + (ulong)(uVar18 + 1) * 2) =
           *(undefined2 *)((long)pLVar23 + (ulong)((int)uVar26 == 0) * 2 + -0x28);
    }
    uVar31 = (ulong)((int)uVar26 == 0);
    *(undefined2 *)(lVar20 + (ulong)uVar32 * 2) =
         *(undefined2 *)((long)pLVar23 + uVar31 * 2 + -0x28);
    *(undefined2 *)(lVar20 + (ulong)(uVar32 + 1) * 2) =
         *(undefined2 *)((long)pLVar23 + uVar26 * 2 + -0x28);
    uVar7 = *(undefined2 *)((long)&pLVar23[-3].prev + 4);
    *(uint *)(plVar2 + 1) = uVar32 + 3;
    *(undefined2 *)(lVar20 + (ulong)(uVar32 + 2) * 2) = uVar7;
    pLVar23 = pLVar15;
    uVar26 = uVar31;
  }
  puVar1 = &this->meshHeader->totalIndices;
  *puVar1 = *puVar1 + (int)plVar2[1];
  lVar30 = lVar30 + 1;
  goto LAB_0010ee93;
}

Assistant:

void
Geometry::buildTristrips(void)
{
	int32 i;
	uint16 *indices;
	MeshHeader *header;
	Mesh *ms, *md;
	StripMesh smesh;

//	trace("%ld\n", sizeof(StripNode));

	this->allocateMeshes(matList.numMaterials, 0, 1);

	smesh.nodes = rwNewT(StripNode, this->numTriangles, MEMDUR_FUNCTION | ID_GEOMETRY);
	ms = this->meshHeader->getMeshes();
	for(int32 i = 0; i < this->matList.numMaterials; i++){
		smesh.loneNodes.init();
		smesh.endNodes.init();
		collectFaces(this, &smesh, i);
		connectNodesPreserve(&smesh);
		buildStrips(&smesh);
printSmesh(&smesh);
//trace("-------\n");
//printLone(&smesh);
//trace("-------\n");
//printEnds(&smesh);
//trace("-------\n");
		// TODO: make this work
//		tunnel(&smesh);
//trace("-------\n");
//printEnds(&smesh);

		ms[i].material = this->matList.materials[i];
		makeMesh(&smesh, &ms[i]);
		this->meshHeader->totalIndices += ms[i].numIndices;
	}
	rwFree(smesh.nodes);

	/* Now re-allocate and copy data */
	header = this->meshHeader;
	this->meshHeader = nil;
	this->allocateMeshes(header->numMeshes, header->totalIndices, 0);
	this->meshHeader->flags = MeshHeader::TRISTRIP;
	md = this->meshHeader->getMeshes();
	indices = md->indices;
	for(i = 0; i < header->numMeshes; i++){
		md[i].material = ms[i].material;
		md[i].numIndices = ms[i].numIndices;
		md[i].indices = indices;
		indices += md[i].numIndices;
		memcpy(md[i].indices, ms[i].indices, md[i].numIndices*sizeof(uint16));
		rwFree(ms[i].indices);
	}
	rwFree(header);

	verifyMesh(this);
}